

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handlers.hpp
# Opt level: O2

void __thiscall
Handlers::packet_handler_register_helper<(PacketFamily)13>::Register
          (packet_handler_register_helper<(PacketFamily)13> *this,PacketAction action,
          character_handler_t f,unsigned_short allow_states,double delay)

{
  packet_handler handler;
  undefined2 uStack_12;
  
  handler.allow_states = allow_states;
  handler.fn_type = 3;
  handler._6_2_ = uStack_12;
  handler.delay = delay;
  handler.f = (_func_void *)f;
  packet_handler_register::Register(packet_handler_register_instance,PACKET_SHOP,action,handler);
  return;
}

Assistant:

void Register(PacketAction action, character_handler_t f, unsigned short allow_states, double delay = 0.0) const
		{
			packet_handler_register_instance->Register(family, action, packet_handler(packet_handler::CharacterFn, reinterpret_cast<void_fn_t>(f), allow_states, delay));
		}